

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

ACT_TYPE __thiscall
despot::TagHistoryModePolicy::Action
          (TagHistoryModePolicy *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  Floor *pFVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  OBS_TYPE OVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  iterator iVar9;
  long *plVar10;
  mapped_type *pmVar11;
  undefined8 uVar12;
  ACT_TYPE AVar13;
  int local_8c;
  Coord rob;
  vector<int,_std::allocator<int>_> actions;
  OBS_TYPE obs;
  
  iVar7 = despot::RandomStreams::position();
  if (iVar7 == 0) {
    AVar13 = this->first_action_;
  }
  else {
    iVar7 = despot::RandomStreams::position();
    if (iVar7 == 1) {
      iVar7 = *(int *)(*(long *)(history + 8) + -4);
      _rob = *(undefined8 *)(*(long *)(history + 0x20) + -8);
      iVar9 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::find(&(this->paths_).
                      super__Vector_base<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar7]._M_t,
                     (key_type_conflict *)&rob);
      if (iVar9._M_node ==
          &(this->paths_).
           super__Vector_base<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[iVar7]._M_t._M_impl.super__Rb_tree_header.
           _M_header) {
        plVar10 = (long *)(**(code **)(*(long *)this->tag_model_ + 0x108))
                                    (this->tag_model_,this->belief_,iVar7,_rob);
        ComputeMode((TagHistoryModePolicy *)&actions,(Belief *)this);
        despot::Floor::NumCells();
        despot::Floor::NumCells();
        despot::Floor::ComputeShortestPath((int)&obs,(int)this + 0x30);
        pmVar11 = std::
                  map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[]((this->paths_).
                               super__Vector_base<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + iVar7,
                               (key_type_conflict *)&rob);
        std::vector<int,_std::allocator<int>_>::_M_move_assign
                  (pmVar11,(_Vector_base<int,_std::allocator<int>_> *)&obs);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&obs);
        if (plVar10 != (long *)0x0) {
          (**(code **)(*plVar10 + 8))();
        }
        despot::State::~State((State *)&actions);
      }
    }
    lVar2 = *(long *)(history + 8);
    lVar3 = *(long *)history;
    iVar7 = despot::RandomStreams::position();
    lVar4 = *(long *)history;
    iVar7 = *(int *)(lVar4 + (long)((int)((ulong)(lVar2 - lVar3) >> 2) - iVar7) * 4);
    lVar2 = *(long *)(history + 8);
    iVar8 = despot::RandomStreams::position();
    obs = *(OBS_TYPE *)
           (*(long *)(history + 0x18) + (long)((int)((ulong)(lVar2 - lVar4) >> 2) - iVar8) * 8);
    pmVar11 = std::
              map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[]((this->paths_).
                           super__Vector_base<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + iVar7,&obs);
    iVar7 = despot::RandomStreams::position();
    if ((ulong)(long)(iVar7 + -1) <
        (ulong)((long)(pmVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(pmVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 2)) {
      iVar7 = despot::RandomStreams::position();
      AVar13 = (pmVar11->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[(long)iVar7 + -1];
    }
    else if (*(OBS_TYPE *)(*(long *)(history + 0x20) + -8) == this->tag_model_->same_loc_obs_) {
      AVar13 = 4;
    }
    else {
      actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      despot::Coord::Coord(&rob);
      OVar5 = this->tag_model_->same_loc_obs_;
      pFVar1 = &this->floor_;
      iVar7 = despot::Floor::NumCells();
      if (OVar5 == (long)iVar7) {
        _rob = despot::Floor::GetCell((int)pFVar1);
      }
      else {
        _rob = BaseTag::MostLikelyRobPosition(this->tag_model_,particles);
      }
      for (local_8c = 0; local_8c < 4; local_8c = local_8c + 1) {
        cVar6 = despot::Compass::Opposite(local_8c,*(int *)(*(long *)(history + 8) + -4));
        if (cVar6 == '\0') {
          uVar12 = despot::operator+(&rob,(Coord *)(&Compass::DIRECTIONS + local_8c));
          cVar6 = despot::Floor::Inside(pFVar1,uVar12);
          if (cVar6 != '\0') {
            std::vector<int,_std::allocator<int>_>::push_back(&actions,&local_8c);
          }
        }
      }
      if (actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        for (local_8c = 0; local_8c < 4; local_8c = local_8c + 1) {
          uVar12 = despot::operator+(&rob,(Coord *)(&Compass::DIRECTIONS + local_8c));
          cVar6 = despot::Floor::Inside(pFVar1,uVar12);
          if (cVar6 != '\0') {
            std::vector<int,_std::allocator<int>_>::push_back(&actions,&local_8c);
          }
        }
      }
      if (actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        AVar13 = 0;
      }
      else {
        iVar7 = despot::Random::NextInt(0x123168);
        AVar13 = actions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar7];
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&actions.super__Vector_base<int,_std::allocator<int>_>);
    }
  }
  return AVar13;
}

Assistant:

ACT_TYPE Action(const vector<State*>& particles,
		RandomStreams& streams, History& history) const {
		if (streams.position() == 0)
		return first_action_;

		if (streams.position() == 1) {
			ACT_TYPE action = history.LastAction();
			OBS_TYPE obs = history.LastObservation();

			if (paths_[action].find(obs) == paths_[action].end()) {
				Belief* belief = tag_model_->Tau(belief_, action, obs);

				State mode = ComputeMode(belief);
				int rob = tag_model_->StateIndexToRobIndex(mode.state_id);
				int opp = tag_model_->StateIndexToOppIndex(mode.state_id);
				paths_[action][obs] = floor_.ComputeShortestPath(rob, opp);

				delete belief;
			}
		}

		ACT_TYPE action = history.Action(history.Size() - streams.position());
		OBS_TYPE obs = history.Observation(history.Size() - streams.position());
		const vector<int>& policy = paths_[action][obs];

		if (streams.position() - 1 < policy.size()) {
			return policy[streams.position() - 1];
		}

		if (history.LastObservation() == tag_model_->same_loc_obs_)
		return tag_model_->TagAction();

		vector<int> actions;
		// Compute rob position
		Coord rob;
		if (tag_model_->same_loc_obs_ != floor_.NumCells()) {
			rob = tag_model_->MostLikelyRobPosition(particles);
		} else {
			rob = floor_.GetCell(history.LastObservation());
		}

		// Don't double back and don't go into walls
		for (int d = 0; d < 4; d ++) {
			if (!Compass::Opposite(d, history.LastAction()) && floor_.Inside(rob + Compass::DIRECTIONS[d])) {
				actions.push_back(d);
			}
		}

		if (actions.size() == 0) {
			for (int d = 0; d < 4; d ++) {
				if (floor_.Inside(rob + Compass::DIRECTIONS[d]))
				actions.push_back(d);
			}
		}

		if (actions.size() == 0) // Rob may be trapped by the obstacles
		return 0;

		int act = actions[Random::RANDOM.NextInt(actions.size())];
		return act;
	}